

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

mt19937 * libtorrent::aux::random_engine(void)

{
  int iVar1;
  long lVar2;
  initializer_list<unsigned_int> __il;
  uint local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  if (random_engine()::dev == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::dev);
    if (iVar1 != 0) {
      ::std::random_device::random_device(&random_engine::dev);
      __cxa_atexit(::std::random_device::~random_device,&random_engine::dev,&__dso_handle);
      __cxa_guard_release(&random_engine()::dev);
    }
  }
  lVar2 = __tls_get_addr(&PTR_004d3780);
  if (*(char *)(lVar2 + 0x20) == '\0') {
    local_28 = ::std::random_device::_M_getval();
    local_24 = ::std::random_device::_M_getval();
    local_20 = ::std::random_device::_M_getval();
    local_1c = ::std::random_device::_M_getval();
    __il._M_len = 4;
    __il._M_array = &local_28;
    ::std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)(lVar2 + 8),__il);
    __cxa_thread_atexit(::std::seed_seq::~seed_seq,(seed_seq *)(lVar2 + 8),&__dso_handle);
    *(undefined1 *)(lVar2 + 0x20) = 1;
  }
  if (*(char *)(lVar2 + 0x13b0) == '\0') {
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed<std::seed_seq>
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)(lVar2 + 0x28),(seed_seq *)(lVar2 + 8));
    *(undefined1 *)(lVar2 + 0x13b0) = 1;
  }
  return (mt19937 *)(lVar2 + 0x28);
}

Assistant:

std::mt19937& random_engine()
		{
#ifdef TORRENT_BUILD_SIMULATOR
			// make sure random numbers are deterministic. Seed with a fixed number
			static std::mt19937 rng(0x82daf973);
#else

#if TORRENT_BROKEN_RANDOM_DEVICE
			struct {
				std::uint32_t operator()() const
				{
					std::uint32_t ret;
					crypto_random_bytes({reinterpret_cast<char*>(&ret), sizeof(ret)});
					return ret;
				}
			} dev;
#else
			static std::random_device dev;
#endif
#ifdef BOOST_NO_CXX11_THREAD_LOCAL
			static std::seed_seq seed({dev(), dev(), dev(), dev()});
			static std::mt19937 rng(seed);
#else
			thread_local static std::seed_seq seed({dev(), dev(), dev(), dev()});
			thread_local static std::mt19937 rng(seed);
#endif
#endif
			return rng;
		}